

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcfread.c
# Opt level: O3

FT_Error pcf_load_font(FT_Stream stream,PCF_Face face,FT_Long face_index)

{
  FT_Byte FVar1;
  FT_Memory pFVar2;
  bool bVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  FT_ULong FVar6;
  ushort uVar7;
  FT_Error FVar8;
  FT_UInt32 FVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  PCF_Table pPVar13;
  PCF_Table pPVar14;
  FT_Pointer P;
  PCF_Metric pPVar15;
  FT_Byte *buffer;
  FT_Pointer pvVar16;
  PCF_Property pPVar17;
  FT_String *pFVar18;
  FT_Bitmap_Size *pFVar19;
  FT_Long FVar20;
  PCF_Property pPVar21;
  char *pcVar22;
  short sVar23;
  short sVar24;
  int iVar25;
  ulong uVar26;
  FT_ULong FVar27;
  FT_ULong FVar28;
  short sVar29;
  ulong uVar30;
  PCF_Metric metric;
  long lVar31;
  ulong uVar32;
  FT_Frame_Field *fields;
  ulong uVar33;
  PCF_Table pPVar34;
  ulong uVar35;
  FT_Bitmap_Size *bsize;
  FT_Error error;
  FT_ULong size;
  FT_ULong format;
  FT_Error local_90;
  FT_Error local_8c;
  FT_Memory local_88;
  undefined8 local_80;
  PCF_Property local_78;
  ulong local_70;
  ulong local_68;
  FT_Memory local_60;
  FT_ULong local_58;
  FT_ULong FStack_50;
  FT_ULong local_48;
  FT_ULong FStack_40;
  ulong local_38;
  
  pFVar2 = (face->root).memory;
  FVar8 = FT_Stream_Seek(stream,0);
  if (FVar8 != 0) {
    return 3;
  }
  local_80._0_4_ = FT_Stream_ReadFields(stream,pcf_toc_header,&face->toc);
  if ((FT_Error)local_80 != 0) {
    return 3;
  }
  if ((face->toc).version != 0x70636601) {
    return 3;
  }
  uVar26 = (face->toc).count;
  if (uVar26 == 0) {
    return 3;
  }
  uVar35 = stream->size;
  if (uVar35 < 0x10) {
    return 3;
  }
  if (9 < uVar26 || uVar35 >> 4 < uVar26) {
    uVar26 = 9;
    if (uVar35 < 0x90) {
      uVar26 = uVar35 >> 4;
    }
    (face->toc).count = uVar26;
  }
  pPVar13 = (PCF_Table)ft_mem_qrealloc(pFVar2,0x20,0,uVar26,(void *)0x0,(FT_Error *)&local_80);
  (face->toc).tables = pPVar13;
  if ((FT_Error)local_80 != 0) {
    return 3;
  }
  local_60 = pFVar2;
  if ((face->toc).count == 0) {
    uVar26 = 0;
LAB_002277d7:
    uVar35 = 0;
    while (uVar26 != uVar35 + 1) {
      bVar3 = false;
      uVar30 = 0;
      FVar28 = pPVar13->offset;
      uVar33 = 1;
      do {
        pPVar14 = pPVar13 + uVar30;
        uVar32 = pPVar13[uVar33].offset;
        if (uVar32 < FVar28) {
          pPVar34 = pPVar13 + uVar33;
          local_58 = pPVar14->type;
          FStack_50 = pPVar14->format;
          local_48 = pPVar14->size;
          FStack_40 = pPVar14->offset;
          FVar28 = pPVar34->type;
          FVar27 = pPVar34->format;
          FVar6 = pPVar34->offset;
          pPVar14->size = pPVar34->size;
          pPVar14->offset = FVar6;
          pPVar14->type = FVar28;
          pPVar14->format = FVar27;
          pPVar34->size = local_48;
          pPVar34->offset = FStack_40;
          pPVar34->type = local_58;
          pPVar34->format = FStack_50;
          uVar32 = pPVar34->offset;
          bVar3 = true;
        }
        if ((uVar32 < pPVar14->size) || (uVar32 - pPVar14->size < pPVar14->offset)) {
          local_80._0_4_ = 9;
          goto LAB_002278e3;
        }
        uVar26 = (face->toc).count;
        bVar4 = uVar33 < uVar26 + ~uVar35;
        uVar30 = uVar33;
        FVar28 = uVar32;
        uVar33 = (ulong)((int)uVar33 + 1);
      } while (bVar4);
      if ((!bVar3) || (uVar35 = (ulong)((int)uVar35 + 1), uVar26 - 1 <= uVar35)) break;
    }
    pPVar13 = (face->toc).tables;
    uVar35 = stream->size;
    pPVar14 = pPVar13;
    if (uVar26 != 1) {
      uVar10 = 1;
      do {
        if ((uVar35 < pPVar14->size) || (uVar35 - pPVar14->size < pPVar14->offset))
        goto LAB_002277c3;
        pPVar14 = pPVar14 + 1;
        uVar30 = (ulong)uVar10;
        uVar10 = uVar10 + 1;
      } while (uVar30 < uVar26 - 1);
    }
  }
  else {
    uVar35 = 1;
    iVar12 = (FT_Error)local_80;
    do {
      local_80._0_4_ = iVar12;
      local_80._0_4_ = FT_Stream_ReadFields(stream,pcf_table_header,pPVar13);
      if ((FT_Error)local_80 != 0) goto LAB_002278e3;
      pPVar13 = pPVar13 + 1;
      uVar26 = (face->toc).count;
      bVar3 = uVar35 < uVar26;
      uVar35 = (ulong)((int)uVar35 + 1);
      iVar12 = 0;
    } while (bVar3);
    pPVar13 = (face->toc).tables;
    if (uVar26 != 1) goto LAB_002277d7;
    uVar35 = stream->size;
    pPVar14 = pPVar13;
  }
  uVar26 = uVar35 - pPVar14->offset;
  if (uVar35 < pPVar14->offset) {
LAB_002277c3:
    local_80._0_4_ = 8;
LAB_002278e3:
    ft_mem_free(local_60,(face->toc).tables);
    (face->toc).tables = (PCF_Table)0x0;
    local_8c = (FT_Error)local_80;
    if ((FT_Error)local_80 != 0) {
      return 3;
    }
    pPVar13 = (PCF_Table)0x0;
  }
  else {
    if (uVar26 < pPVar14->size) {
      pPVar14->size = uVar26;
    }
    local_8c = 0;
  }
  (face->root).num_faces = 1;
  (face->root).face_index = 0;
  if (face_index < 0) {
    return 0;
  }
  pFVar2 = (face->root).memory;
  local_90 = pcf_seek_to_table_type(stream,pPVar13,(face->toc).count,1,&local_58,&local_80);
  if ((local_90 == 0) &&
     (FVar9 = FT_Stream_ReadULongLE(stream,&local_90), FVar9 < 0x100 && local_90 == 0)) {
    if ((FVar9 & 4) == 0) {
      uVar10 = FT_Stream_ReadULongLE(stream,&local_90);
    }
    else {
      uVar10 = FT_Stream_ReadULong(stream,&local_90);
    }
    uVar26 = (ulong)uVar10;
    if (local_90 != 0) goto LAB_002279eb;
    local_88 = (FT_Memory)CONCAT44(local_88._4_4_,FVar9);
    if (CONCAT44(local_80._4_4_,(FT_Error)local_80) / 9 < uVar26) {
      local_90 = 8;
      goto LAB_002279eb;
    }
    local_68 = 0x100;
    if (uVar10 < 0x100) {
      local_68 = uVar26;
    }
    face->nprops = (int)local_68;
    buffer = (FT_Byte *)0x0;
    local_70 = uVar26;
    local_38 = CONCAT44(local_80._4_4_,(FT_Error)local_80);
    P = ft_mem_qrealloc(pFVar2,0x18,0,local_68,(void *)0x0,&local_90);
    if (local_90 == 0) {
      if (local_70 != 0) {
        local_78 = (PCF_Property)(local_68 * 0x18);
        buffer = (FT_Byte *)0x0;
        pPVar17 = (PCF_Property)0x0;
        FVar8 = local_90;
        do {
          local_90 = FVar8;
          if (((ulong)local_88 & 4) == 0) {
            fields = pcf_property_header;
          }
          else {
            fields = pcf_property_msb_header;
          }
          local_90 = FT_Stream_ReadFields(stream,fields,(void *)((long)P + (long)pPVar17));
          if (local_90 != 0) goto LAB_002279f0;
          pPVar17 = pPVar17 + 1;
          local_90 = 0;
          FVar8 = 0;
        } while (local_78 != pPVar17);
      }
      local_90 = FT_Stream_Skip(stream,(local_70 - local_68) * 9);
      if (local_90 == 0) {
        FVar8 = 0;
        if (((local_70 & 3) != 0) && (FVar8 = FT_Stream_Skip(stream,4 - (local_70 & 3)), FVar8 != 0)
           ) goto LAB_00227b9d;
        local_90 = FVar8;
        if (((ulong)local_88 & 4) == 0) {
          uVar10 = FT_Stream_ReadULongLE(stream,&local_90);
        }
        else {
          uVar10 = FT_Stream_ReadULong(stream,&local_90);
        }
        if (local_90 == 0) {
          uVar26 = (ulong)uVar10;
          if (uVar26 <= local_38 + local_70 * -9) {
            uVar35 = 0x1000100;
            if (uVar26 < 0x1000100) {
              uVar35 = uVar26;
            }
            buffer = (FT_Byte *)ft_mem_qalloc(pFVar2,uVar35 + 1,&local_90);
            if ((local_90 == 0) && (local_90 = FT_Stream_Read(stream,buffer,uVar35), local_90 == 0))
            {
              buffer[uVar35] = '\0';
              local_78 = (PCF_Property)ft_mem_realloc(pFVar2,0x18,0,local_68,(void *)0x0,&local_90);
              if (local_90 == 0) {
                face->properties = local_78;
                if ((int)local_70 != 0) {
                  local_70 = local_68 * 0x18;
                  local_88 = (FT_Memory)0x0;
                  do {
                    if (uVar35 < *(ulong *)((long)P + (long)local_88)) {
LAB_0022813f:
                      local_90 = 9;
                      goto LAB_002279f0;
                    }
                    pvVar16 = ft_mem_strdup(pFVar2,(char *)(buffer + *(ulong *)((long)P +
                                                                               (long)local_88)),
                                            &local_90);
                    *(FT_Pointer *)((long)&local_78->name + (long)local_88) = pvVar16;
                    if (local_90 != 0) goto LAB_002279f0;
                    FVar1 = *(FT_Byte *)((long)P + (long)local_88 + 8U);
                    (&local_78->isString)[(long)local_88] = FVar1;
                    uVar26 = *(ulong *)((long)P + (long)local_88 + 0x10U);
                    if (FVar1 == '\0') {
                      *(ulong *)((long)&local_78->value + (long)local_88) = uVar26;
                    }
                    else {
                      if (uVar35 < uVar26) goto LAB_0022813f;
                      pvVar16 = ft_mem_strdup(pFVar2,(char *)(buffer + uVar26),&local_90);
                      *(FT_Pointer *)((long)&local_78->value + (long)local_88) = pvVar16;
                      if (local_90 != 0) goto LAB_002279f0;
                    }
                    local_88 = (FT_Memory)((long)local_88 + 0x18);
                  } while ((FT_Memory)local_70 != local_88);
                }
                local_90 = 0;
              }
            }
            goto LAB_002279f0;
          }
          local_90 = 8;
        }
      }
      else {
LAB_00227b9d:
        local_90 = 0x53;
      }
      buffer = (FT_Byte *)0x0;
    }
  }
  else {
LAB_002279eb:
    buffer = (FT_Byte *)0x0;
    P = (void *)0x0;
  }
LAB_002279f0:
  ft_mem_free(pFVar2,P);
  ft_mem_free(pFVar2,buffer);
  local_8c = local_90;
  if (local_90 != 0) {
    return 3;
  }
  FVar28 = (face->toc).count;
  if (FVar28 != 0) {
    pPVar13 = (face->toc).tables;
    pPVar14 = pPVar13;
    FVar27 = FVar28;
    do {
      if (pPVar14->type == 0x100) {
        bVar3 = false;
        goto LAB_00227a6f;
      }
      pPVar14 = pPVar14 + 1;
      FVar27 = FVar27 - 1;
    } while (FVar27 != 0);
  }
  FVar8 = pcf_get_accel(stream,face,2);
  if (FVar8 != 0) {
    return 3;
  }
  FVar28 = (face->toc).count;
  pPVar13 = (face->toc).tables;
  bVar3 = true;
  local_8c = 0;
LAB_00227a6f:
  pFVar2 = (face->root).memory;
  local_90 = pcf_seek_to_table_type(stream,pPVar13,FVar28,4,&local_58,&local_80);
  if (local_90 != 0) {
    return 3;
  }
  FVar9 = FT_Stream_ReadULongLE(stream,&local_90);
  uVar26 = (ulong)FVar9;
  if (local_90 != 0) {
    return 3;
  }
  if ((FVar9 & 0xfffffe00) != 0) {
    return 3;
  }
  local_88 = pFVar2;
  local_58 = uVar26;
  if ((FVar9 & 0xffffff00) == 0) {
    if ((FVar9 & 4) == 0) {
      uVar10 = FT_Stream_ReadULongLE(stream,&local_90);
    }
    else {
      uVar10 = FT_Stream_ReadULong(stream,&local_90);
    }
    uVar35 = (ulong)uVar10;
  }
  else {
    if ((FVar9 & 4) == 0) {
      uVar7 = FT_Stream_ReadUShortLE(stream,&local_90);
    }
    else {
      uVar7 = FT_Stream_ReadUShort(stream,&local_90);
    }
    uVar35 = (ulong)uVar7;
  }
  if (local_90 != 0) {
    return 3;
  }
  if ((FVar9 & 0xffffff00) == 0) {
    uVar30 = CONCAT44(local_80._4_4_,(FT_Error)local_80) / 0xc;
  }
  else {
    uVar30 = CONCAT44(local_80._4_4_,(FT_Error)local_80) / 5;
  }
  if (uVar30 <= uVar35 - 1) {
    return 3;
  }
  FVar28 = uVar35 + 1;
  if (0xfffe < uVar35) {
    FVar28 = 0xffff;
  }
  face->nmetrics = FVar28;
  pPVar15 = (PCF_Metric)ft_mem_qrealloc(local_88,0x18,0,FVar28,(void *)0x0,&local_90);
  face->metrics = pPVar15;
  if (local_90 != 0) {
    return 3;
  }
  if (1 < face->nmetrics) {
    uVar35 = 1;
    FVar8 = local_90;
    do {
      local_90 = FVar8;
      metric = pPVar15 + 1;
      local_90 = pcf_get_metric(stream,uVar26,metric);
      pPVar15[1].bits = 0;
      if (local_90 != 0) {
        ft_mem_free(local_88,face->metrics);
        face->metrics = (PCF_Metric)0x0;
        local_8c = local_90;
        if (local_90 != 0) {
          return 3;
        }
        goto LAB_00227d42;
      }
      if ((pPVar15[1].rightSideBearing < metric->leftSideBearing) ||
         (SBORROW4((int)pPVar15[1].ascent,-(int)pPVar15[1].descent) !=
          (int)pPVar15[1].ascent + (int)pPVar15[1].descent < 0)) {
        pPVar15[1].descent = 0;
        metric->leftSideBearing = 0;
        metric->rightSideBearing = 0;
        metric->characterWidth = 0;
        metric->ascent = 0;
      }
      uVar35 = uVar35 + 1;
      pPVar15 = metric;
      FVar8 = 0;
    } while (uVar35 < face->nmetrics);
  }
  local_8c = 0;
LAB_00227d42:
  FVar8 = pcf_seek_to_table_type(stream,(face->toc).tables,(face->toc).count,8,&local_58,&local_80);
  if (FVar8 != 0) {
    return 3;
  }
  local_90 = FT_Stream_EnterFrame(stream,8);
  if (local_90 != 0) {
    return 3;
  }
  FVar9 = FT_Stream_GetULongLE(stream);
  local_88 = (FT_Memory)(ulong)FVar9;
  if ((FVar9 & 4) == 0) {
    uVar10 = FT_Stream_GetULongLE(stream);
  }
  else {
    uVar10 = FT_Stream_GetULong(stream);
  }
  FT_Stream_ExitFrame(stream);
  if (0xff < (uint)local_88) {
    return 3;
  }
  uVar11 = 0xfffe;
  if (uVar10 < 0xfffe) {
    uVar11 = uVar10;
  }
  uVar26 = (ulong)uVar11;
  if (face->nmetrics - 1 != uVar26) {
    return 3;
  }
  if (uVar10 != 0) {
    local_78 = (PCF_Property)(stream->pos + uVar26 * 4 + 0x10);
    uVar35 = CONCAT44(local_80._4_4_,(FT_Error)local_80);
    lVar31 = 0;
    do {
      if (((ulong)local_88 & 4) == 0) {
        uVar10 = FT_Stream_ReadULongLE(stream,&local_90);
      }
      else {
        uVar10 = FT_Stream_ReadULong(stream,&local_90);
      }
      uVar30 = 0;
      if (uVar10 <= uVar35) {
        uVar30 = (ulong)uVar10;
      }
      *(ulong *)((long)&face->metrics[1].bits + lVar31) = (long)&local_78->name + uVar30;
      lVar31 = lVar31 + 0x18;
    } while (uVar26 * 0x18 != lVar31);
    if (local_90 != 0) {
      return 3;
    }
  }
  lVar31 = 4;
  do {
    if (((ulong)local_88 & 4) == 0) {
      FT_Stream_ReadULongLE(stream,&local_90);
    }
    else {
      FT_Stream_ReadULong(stream,&local_90);
    }
    if (local_90 != 0) {
      return 3;
    }
    lVar31 = lVar31 + -1;
  } while (lVar31 != 0);
  face->bitmapsFormat = (FT_ULong)local_88;
  local_8c = 0;
  local_8c = pcf_get_encodings(stream,face);
  if (local_8c != 0) {
    return 3;
  }
  FVar8 = 0;
  if ((!bVar3) && (FVar8 = pcf_get_accel(stream,face,0x100), FVar8 != 0)) {
    return 3;
  }
  local_8c = FVar8;
  uVar26 = (face->root).face_flags;
  (face->root).face_flags = uVar26 | 0x12;
  if ((face->accel).constantWidth != '\0') {
    (face->root).face_flags = uVar26 | 0x16;
  }
  local_8c = pcf_interpret_style(face);
  if (local_8c != 0) {
    return 3;
  }
  pPVar17 = pcf_find_property(face,"FAMILY_NAME");
  pFVar2 = local_60;
  if ((pPVar17 == (PCF_Property)0x0) || (pPVar17->isString == '\0')) {
    (face->root).family_name = (FT_String *)0x0;
  }
  else {
    pFVar18 = (FT_String *)ft_mem_strdup(local_60,(pPVar17->value).atom,&local_8c);
    (face->root).family_name = pFVar18;
    if (local_8c != 0) {
      return 3;
    }
  }
  (face->root).num_glyphs = face->nmetrics;
  (face->root).num_fixed_sizes = 1;
  pFVar19 = (FT_Bitmap_Size *)ft_mem_alloc(pFVar2,0x20,&local_8c);
  (face->root).available_sizes = pFVar19;
  if (local_8c != 0) {
    return 3;
  }
  uVar35 = (face->accel).fontDescent + (face->accel).fontAscent;
  uVar26 = -uVar35;
  if (0 < (long)uVar35) {
    uVar26 = uVar35;
  }
  sVar23 = 0x7fff;
  if (uVar26 < 0x8000) {
    sVar29 = (short)uVar35;
    sVar23 = -sVar29;
    if (0 < sVar29) {
      sVar23 = sVar29;
    }
  }
  pFVar19->height = sVar23;
  pPVar17 = pcf_find_property(face,"AVERAGE_WIDTH");
  if (pPVar17 == (PCF_Property)0x0) {
    sVar23 = (short)((sVar23 * 2 + 1) / 3);
  }
  else {
    FVar28 = (pPVar17->value).ul;
    uVar26 = -FVar28;
    if (0 < (long)FVar28) {
      uVar26 = FVar28;
    }
    sVar23 = 0x7fff;
    if (uVar26 < 0x4fff2) {
      auVar5 = SEXT816((long)(FVar28 + 5)) * SEXT816(0x6666666666666667);
      sVar29 = (short)(auVar5._8_4_ >> 2) - (auVar5._14_2_ >> 0xf);
      sVar23 = -sVar29;
      if (0 < sVar29) {
        sVar23 = sVar29;
      }
    }
  }
  pFVar19->width = sVar23;
  pPVar17 = pcf_find_property(face,"POINT_SIZE");
  if (pPVar17 != (PCF_Property)0x0) {
    uVar26 = (pPVar17->value).l;
    uVar35 = -uVar26;
    if (0 < (long)uVar26) {
      uVar35 = uVar26;
    }
    FVar20 = 0x7fff;
    if (uVar35 < 0x504c3) {
      FVar20 = FT_MulDiv(uVar35,0x70800,0x11a4e);
    }
    pFVar19->size = FVar20;
  }
  pPVar17 = pcf_find_property(face,"PIXEL_SIZE");
  if (pPVar17 != (PCF_Property)0x0) {
    FVar28 = (pPVar17->value).ul;
    uVar26 = -FVar28;
    if (0 < (long)FVar28) {
      uVar26 = FVar28;
    }
    uVar35 = 0x1fffc0;
    if (uVar26 < 0x8000) {
      iVar25 = (int)(short)FVar28;
      iVar12 = -iVar25;
      if (0 < iVar25) {
        iVar12 = iVar25;
      }
      uVar35 = (ulong)(uint)(iVar12 << 6);
    }
    pFVar19->y_ppem = uVar35;
  }
  pPVar17 = pcf_find_property(face,"RESOLUTION_X");
  if (pPVar17 == (PCF_Property)0x0) {
    sVar23 = 0;
  }
  else {
    uVar26 = (pPVar17->value).l;
    uVar35 = -uVar26;
    if (0 < (long)uVar26) {
      uVar35 = uVar26;
    }
    sVar23 = 0x7fff;
    if (uVar35 < 0x8000) {
      sVar29 = (short)uVar26;
      sVar23 = -sVar29;
      if (0 < sVar29) {
        sVar23 = sVar29;
      }
    }
  }
  pPVar17 = pcf_find_property(face,"RESOLUTION_Y");
  if (pPVar17 == (PCF_Property)0x0) {
    FVar20 = pFVar19->y_ppem;
    if (FVar20 == 0) {
      FVar20 = pFVar19->size;
      pFVar19->y_ppem = FVar20;
    }
    goto LAB_002283b9;
  }
  uVar26 = (pPVar17->value).l;
  uVar35 = -uVar26;
  if (0 < (long)uVar26) {
    uVar35 = uVar26;
  }
  if (uVar35 < 0x8000) {
    sVar24 = (short)uVar26;
    sVar29 = -sVar24;
    if (0 < sVar24) {
      sVar29 = sVar24;
    }
    FVar20 = pFVar19->y_ppem;
    if (FVar20 == 0) {
      FVar20 = pFVar19->size;
      pFVar19->y_ppem = FVar20;
      if ((uVar26 & 0xffff) == 0) goto LAB_002283b9;
      goto LAB_0022838a;
    }
  }
  else {
    FVar20 = pFVar19->y_ppem;
    sVar29 = 0x7fff;
    if (FVar20 == 0) {
      FVar20 = pFVar19->size;
      pFVar19->y_ppem = FVar20;
      sVar29 = 0x7fff;
LAB_0022838a:
      FVar20 = FT_MulDiv(FVar20,(long)sVar29,0x48);
      pFVar19->y_ppem = FVar20;
    }
  }
  if ((sVar23 != 0) && (sVar29 != 0)) {
    FVar20 = FT_MulDiv(FVar20,(long)sVar23,(long)sVar29);
  }
LAB_002283b9:
  pFVar19->x_ppem = FVar20;
  pPVar17 = pcf_find_property(face,"CHARSET_REGISTRY");
  pPVar21 = pcf_find_property(face,"CHARSET_ENCODING");
  pFVar2 = local_60;
  if (((pPVar17 != (PCF_Property)0x0) && (pPVar21 != (PCF_Property)0x0 && pPVar17->isString != '\0')
      ) && (pPVar21->isString != '\0')) {
    pcVar22 = (char *)ft_mem_strdup(local_60,(pPVar21->value).atom,&local_8c);
    face->charset_encoding = pcVar22;
    if (local_8c != 0) {
      return 3;
    }
    pcVar22 = (char *)ft_mem_strdup(pFVar2,(pPVar17->value).atom,&local_8c);
    face->charset_registry = pcVar22;
  }
  if (local_8c != 0) {
    return 3;
  }
  return 0;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  pcf_load_font( FT_Stream  stream,
                 PCF_Face   face,
                 FT_Long    face_index )
  {
    FT_Face    root   = FT_FACE( face );
    FT_Error   error;
    FT_Memory  memory = FT_FACE( face )->memory;
    FT_Bool    hasBDFAccelerators;


    error = pcf_read_TOC( stream, face );
    if ( error )
      goto Exit;

    root->num_faces  = 1;
    root->face_index = 0;

    /* If we are performing a simple font format check, exit immediately. */
    if ( face_index < 0 )
      return FT_Err_Ok;

    error = pcf_get_properties( stream, face );
    if ( error )
      goto Exit;

    /* Use the old accelerators if no BDF accelerators are in the file. */
    hasBDFAccelerators = pcf_has_table_type( face->toc.tables,
                                             face->toc.count,
                                             PCF_BDF_ACCELERATORS );
    if ( !hasBDFAccelerators )
    {
      error = pcf_get_accel( stream, face, PCF_ACCELERATORS );
      if ( error )
        goto Exit;
    }

    /* metrics */
    error = pcf_get_metrics( stream, face );
    if ( error )
      goto Exit;

    /* bitmaps */
    error = pcf_get_bitmaps( stream, face );
    if ( error )
      goto Exit;

    /* encodings */
    error = pcf_get_encodings( stream, face );
    if ( error )
      goto Exit;

    /* BDF style accelerators (i.e. bounds based on encoded glyphs) */
    if ( hasBDFAccelerators )
    {
      error = pcf_get_accel( stream, face, PCF_BDF_ACCELERATORS );
      if ( error )
        goto Exit;
    }

    /* XXX: TO DO: inkmetrics and glyph_names are missing */

    /* now construct the face object */
    {
      PCF_Property  prop;


      root->face_flags |= FT_FACE_FLAG_FIXED_SIZES |
                          FT_FACE_FLAG_HORIZONTAL;

      if ( face->accel.constantWidth )
        root->face_flags |= FT_FACE_FLAG_FIXED_WIDTH;

      if ( FT_SET_ERROR( pcf_interpret_style( face ) ) )
        goto Exit;

      prop = pcf_find_property( face, "FAMILY_NAME" );
      if ( prop && prop->isString )
      {

#ifdef PCF_CONFIG_OPTION_LONG_FAMILY_NAMES

        PCF_Driver  driver = (PCF_Driver)FT_FACE_DRIVER( face );


        if ( !driver->no_long_family_names )
        {
          /* Prepend the foundry name plus a space to the family name.     */
          /* There are many fonts just called `Fixed' which look           */
          /* completely different, and which have nothing to do with each  */
          /* other.  When selecting `Fixed' in KDE or Gnome one gets       */
          /* results that appear rather random, the style changes often if */
          /* one changes the size and one cannot select some fonts at all. */
          /*                                                               */
          /* We also check whether we have `wide' characters; all put      */
          /* together, we get family names like `Sony Fixed' or `Misc      */
          /* Fixed Wide'.                                                  */

          PCF_Property  foundry_prop, point_size_prop, average_width_prop;

          int  l    = ft_strlen( prop->value.atom ) + 1;
          int  wide = 0;


          foundry_prop       = pcf_find_property( face, "FOUNDRY" );
          point_size_prop    = pcf_find_property( face, "POINT_SIZE" );
          average_width_prop = pcf_find_property( face, "AVERAGE_WIDTH" );

          if ( point_size_prop && average_width_prop )
          {
            if ( average_width_prop->value.l >= point_size_prop->value.l )
            {
              /* This font is at least square shaped or even wider */
              wide = 1;
              l   += ft_strlen( " Wide" );
            }
          }

          if ( foundry_prop && foundry_prop->isString )
          {
            l += ft_strlen( foundry_prop->value.atom ) + 1;

            if ( FT_QALLOC( root->family_name, l ) )
              goto Exit;

            ft_strcpy( root->family_name, foundry_prop->value.atom );
            ft_strcat( root->family_name, " " );
            ft_strcat( root->family_name, prop->value.atom );
          }
          else
          {
            if ( FT_QALLOC( root->family_name, l ) )
              goto Exit;

            ft_strcpy( root->family_name, prop->value.atom );
          }

          if ( wide )
            ft_strcat( root->family_name, " Wide" );
        }
        else

#endif /* PCF_CONFIG_OPTION_LONG_FAMILY_NAMES */

        {
          if ( FT_STRDUP( root->family_name, prop->value.atom ) )
            goto Exit;
        }
      }
      else
        root->family_name = NULL;

      root->num_glyphs = (FT_Long)face->nmetrics;

      root->num_fixed_sizes = 1;
      if ( FT_NEW( root->available_sizes ) )
        goto Exit;

      {
        FT_Bitmap_Size*  bsize = root->available_sizes;
        FT_Short         resolution_x = 0, resolution_y = 0;


        /* for simplicity, we take absolute values of integer properties */

#if 0
        bsize->height = face->accel.maxbounds.ascent << 6;
#endif

#ifdef FT_DEBUG_LEVEL_TRACE
        if ( face->accel.fontAscent + face->accel.fontDescent < 0 )
          FT_TRACE0(( "pcf_load_font: negative height\n" ));
#endif
        if ( FT_ABS( face->accel.fontAscent +
                     face->accel.fontDescent ) > 0x7FFF )
        {
          bsize->height = 0x7FFF;
          FT_TRACE0(( "pcf_load_font: clamping height to value %d\n",
                      bsize->height ));
        }
        else
          bsize->height = FT_ABS( (FT_Short)( face->accel.fontAscent +
                                              face->accel.fontDescent ) );

        prop = pcf_find_property( face, "AVERAGE_WIDTH" );
        if ( prop )
        {
#ifdef FT_DEBUG_LEVEL_TRACE
          if ( prop->value.l < 0 )
            FT_TRACE0(( "pcf_load_font: negative average width\n" ));
#endif
          if ( ( FT_ABS( prop->value.l ) > 0x7FFFL * 10 - 5 ) )
          {
            bsize->width = 0x7FFF;
            FT_TRACE0(( "pcf_load_font: clamping average width to value %d\n",
                        bsize->width ));
          }
          else
            bsize->width = FT_ABS( (FT_Short)( ( prop->value.l + 5 ) / 10 ) );
        }
        else
        {
          /* this is a heuristical value */
          bsize->width = ( bsize->height * 2 + 1 ) / 3;
        }

        prop = pcf_find_property( face, "POINT_SIZE" );
        if ( prop )
        {
#ifdef FT_DEBUG_LEVEL_TRACE
          if ( prop->value.l < 0 )
            FT_TRACE0(( "pcf_load_font: negative point size\n" ));
#endif
          /* convert from 722.7 decipoints to 72 points per inch */
          if ( FT_ABS( prop->value.l ) > 0x504C2L ) /* 0x7FFF * 72270/7200 */
          {
            bsize->size = 0x7FFF;
            FT_TRACE0(( "pcf_load_font: clamping point size to value %ld\n",
                        bsize->size ));
          }
          else
            bsize->size = FT_MulDiv( FT_ABS( prop->value.l ),
                                     64 * 7200,
                                     72270L );
        }

        prop = pcf_find_property( face, "PIXEL_SIZE" );
        if ( prop )
        {
#ifdef FT_DEBUG_LEVEL_TRACE
          if ( prop->value.l < 0 )
            FT_TRACE0(( "pcf_load_font: negative pixel size\n" ));
#endif
          if ( FT_ABS( prop->value.l ) > 0x7FFF )
          {
            bsize->y_ppem = 0x7FFF << 6;
            FT_TRACE0(( "pcf_load_font: clamping pixel size to value %ld\n",
                        bsize->y_ppem ));
          }
          else
            bsize->y_ppem = FT_ABS( (FT_Short)prop->value.l ) << 6;
        }

        prop = pcf_find_property( face, "RESOLUTION_X" );
        if ( prop )
        {
#ifdef FT_DEBUG_LEVEL_TRACE
          if ( prop->value.l < 0 )
            FT_TRACE0(( "pcf_load_font: negative X resolution\n" ));
#endif
          if ( FT_ABS( prop->value.l ) > 0x7FFF )
          {
            resolution_x = 0x7FFF;
            FT_TRACE0(( "pcf_load_font: clamping X resolution to value %d\n",
                        resolution_x ));
          }
          else
            resolution_x = FT_ABS( (FT_Short)prop->value.l );
        }

        prop = pcf_find_property( face, "RESOLUTION_Y" );
        if ( prop )
        {
#ifdef FT_DEBUG_LEVEL_TRACE
          if ( prop->value.l < 0 )
            FT_TRACE0(( "pcf_load_font: negative Y resolution\n" ));
#endif
          if ( FT_ABS( prop->value.l ) > 0x7FFF )
          {
            resolution_y = 0x7FFF;
            FT_TRACE0(( "pcf_load_font: clamping Y resolution to value %d\n",
                        resolution_y ));
          }
          else
            resolution_y = FT_ABS( (FT_Short)prop->value.l );
        }

        if ( bsize->y_ppem == 0 )
        {
          bsize->y_ppem = bsize->size;
          if ( resolution_y )
            bsize->y_ppem = FT_MulDiv( bsize->y_ppem, resolution_y, 72 );
        }
        if ( resolution_x && resolution_y )
          bsize->x_ppem = FT_MulDiv( bsize->y_ppem,
                                     resolution_x,
                                     resolution_y );
        else
          bsize->x_ppem = bsize->y_ppem;
      }

      /* set up charset */
      {
        PCF_Property  charset_registry, charset_encoding;


        charset_registry = pcf_find_property( face, "CHARSET_REGISTRY" );
        charset_encoding = pcf_find_property( face, "CHARSET_ENCODING" );

        if ( charset_registry && charset_registry->isString &&
             charset_encoding && charset_encoding->isString )
        {
          if ( FT_STRDUP( face->charset_encoding,
                          charset_encoding->value.atom ) ||
               FT_STRDUP( face->charset_registry,
                          charset_registry->value.atom ) )
            goto Exit;
        }
      }
    }

  Exit:
    if ( error )
    {
      /* This is done to respect the behaviour of the original */
      /* PCF font driver.                                      */
      error = FT_THROW( Invalid_File_Format );
    }

    return error;
  }